

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImVec2 base_pos,float base_scale,ImGuiMouseCursor mouse_cursor,ImU32 col_fill,
               ImU32 col_border,ImU32 col_shadow)

{
  ImVec2 *uv_max;
  ImFontAtlas *this;
  ImGuiContext *pIVar1;
  ImTextureID pvVar2;
  ImTextureID pvVar3;
  bool bVar4;
  ImVec2 *pIVar5;
  ImVec2 *local_178;
  bool local_169;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImTextureID local_d8;
  ImTextureID tex_id;
  ImDrawList *draw_list;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImRect local_ac;
  ImRect local_9c;
  float local_8c;
  ImVec2 IStack_88;
  float scale;
  ImVec2 pos;
  ImGuiViewportP *viewport;
  ImVec2 uv [4];
  ImVec2 local_4c;
  ImVec2 size;
  ImVec2 offset;
  int n;
  ImFontAtlas *font_atlas;
  ImGuiContext *g;
  ImU32 col_shadow_local;
  ImU32 col_border_local;
  ImU32 col_fill_local;
  ImGuiMouseCursor mouse_cursor_local;
  float base_scale_local;
  ImVec2 base_pos_local;
  
  pIVar1 = GImGui;
  local_169 = 8 < (uint)mouse_cursor;
  _mouse_cursor_local = base_pos;
  if (local_169) {
    __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0xcbe,
                  "void ImGui::RenderMouseCursor(ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                 );
  }
  this = ((GImGui->DrawListSharedData).Font)->ContainerAtlas;
  for (offset.x = 0.0; (int)offset.x < (pIVar1->Viewports).Size;
      offset.x = (float)((int)offset.x + 1)) {
    ImVec2::ImVec2(&size);
    ImVec2::ImVec2(&local_4c);
    local_178 = (ImVec2 *)&viewport;
    do {
      ImVec2::ImVec2(local_178);
      local_178 = local_178 + 1;
    } while (local_178 != uv + 3);
    bVar4 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&size,&local_4c,(ImVec2 *)&viewport,uv + 1);
    if (bVar4) {
      pIVar5 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,(int)offset.x);
      pos = *pIVar5;
      IStack_88 = ::operator-((ImVec2 *)&mouse_cursor_local,&size);
      local_8c = base_scale * *(float *)((long)pos + 0x28);
      local_9c = ImGuiViewportP::GetMainRect((ImGuiViewportP *)pos);
      ImVec2::ImVec2((ImVec2 *)((long)&draw_list + 4),local_4c.x + 2.0,local_4c.y + 2.0);
      local_bc = ::operator*((ImVec2 *)((long)&draw_list + 4),local_8c);
      local_b4 = ::operator+(&stack0xffffffffffffff78,&local_bc);
      ImRect::ImRect(&local_ac,&stack0xffffffffffffff78,&local_b4);
      bVar4 = ImRect::Overlaps(&local_9c,&local_ac);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        tex_id = GetForegroundDrawList((ImGuiViewport *)pos);
        local_d8 = this->TexID;
        ImDrawList::PushTextureID((ImDrawList *)tex_id,local_d8);
        pvVar3 = tex_id;
        pvVar2 = local_d8;
        ImVec2::ImVec2(&local_f0,1.0,0.0);
        local_e8 = ::operator*(&local_f0,local_8c);
        local_e0 = ::operator+(&stack0xffffffffffffff78,&local_e8);
        ImVec2::ImVec2(&local_110,1.0,0.0);
        local_108 = ::operator+(&local_110,&local_4c);
        local_100 = ::operator*(&local_108,local_8c);
        local_f8 = ::operator+(&stack0xffffffffffffff78,&local_100);
        pIVar5 = uv + 1;
        uv_max = uv + 2;
        ImDrawList::AddImage
                  ((ImDrawList *)pvVar3,pvVar2,&local_e0,&local_f8,pIVar5,uv_max,col_shadow);
        pvVar3 = tex_id;
        pvVar2 = local_d8;
        ImVec2::ImVec2(&local_128,2.0,0.0);
        local_120 = ::operator*(&local_128,local_8c);
        local_118 = ::operator+(&stack0xffffffffffffff78,&local_120);
        ImVec2::ImVec2(&local_148,2.0,0.0);
        local_140 = ::operator+(&local_148,&local_4c);
        local_138 = ::operator*(&local_140,local_8c);
        local_130 = ::operator+(&stack0xffffffffffffff78,&local_138);
        ImDrawList::AddImage
                  ((ImDrawList *)pvVar3,pvVar2,&local_118,&local_130,pIVar5,uv_max,col_shadow);
        pvVar3 = tex_id;
        pvVar2 = local_d8;
        local_158 = ::operator*(&local_4c,local_8c);
        local_150 = ::operator+(&stack0xffffffffffffff78,&local_158);
        ImDrawList::AddImage
                  ((ImDrawList *)pvVar3,pvVar2,&stack0xffffffffffffff78,&local_150,pIVar5,uv_max,
                   col_border);
        pvVar3 = tex_id;
        pvVar2 = local_d8;
        local_168 = ::operator*(&local_4c,local_8c);
        local_160 = ::operator+(&stack0xffffffffffffff78,&local_168);
        ImDrawList::AddImage
                  ((ImDrawList *)pvVar3,pvVar2,&stack0xffffffffffffff78,&local_160,
                   (ImVec2 *)&viewport,uv,col_fill);
        ImDrawList::PopTextureID((ImDrawList *)tex_id);
      }
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImVec2 base_pos, float base_scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);
    ImFontAtlas* font_atlas = g.DrawListSharedData.Font->ContainerAtlas;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        // We scale cursor with current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor.
        ImVec2 offset, size, uv[4];
        if (!font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
            continue;
        ImGuiViewportP* viewport = g.Viewports[n];
        const ImVec2 pos = base_pos - offset;
        const float scale = base_scale * viewport->DpiScale;
        if (!viewport->GetMainRect().Overlaps(ImRect(pos, pos + ImVec2(size.x + 2, size.y + 2) * scale)))
            continue;
        ImDrawList* draw_list = GetForegroundDrawList(viewport);
        ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}